

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall Jupiter::Socket::Data::Data(Data *this,size_t buffer_size)

{
  size_t buffer_size_local;
  Data *this_local;
  
  Buffer::Buffer(&this->buffer);
  this->rawSock = -1;
  this->remote_port = 0;
  this->bound_port = 0;
  std::__cxx11::string::string((string *)&this->remote_host);
  std::__cxx11::string::string((string *)&this->bound_host);
  this->sockType = 3;
  this->sockProto = 0xff;
  this->is_shutdown = false;
  Buffer::reserve(&this->buffer,buffer_size);
  return;
}

Assistant:

Jupiter::Socket::Data::Data(size_t buffer_size) {
	Jupiter::Socket::Data::buffer.reserve(buffer_size);
}